

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_>::GetNode
          (TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_> *this,
          FMD5Holder key)

{
  TValueTraits<FCompatValues> local_51;
  undefined8 uStack_50;
  TValueTraits<FCompatValues> traits;
  Node *n;
  TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_> *this_local;
  FMD5Holder key_local;
  
  key_local._8_8_ = FindKey(this,key);
  if ((Node *)key_local._8_8_ == (Node *)0x0) {
    uStack_50 = key._0_8_;
    key_local._8_8_ = NewKey(this,key);
    TValueTraits<FCompatValues>::Init(&local_51,&(((Node *)key_local._8_8_)->Pair).Value);
  }
  return (Node *)key_local._8_8_;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}